

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void us_socket_context_free(int ssl,us_socket_context_t *context)

{
  us_socket_context_t *in_RSI;
  int in_EDI;
  
  free((in_RSI->options).ca_file_name);
  free((in_RSI->options).cert_file_name);
  free((in_RSI->options).dh_params_file_name);
  free((in_RSI->options).key_file_name);
  free((in_RSI->options).passphrase);
  if (in_EDI == 0) {
    us_internal_loop_unlink(in_RSI->loop,in_RSI);
    free(in_RSI);
  }
  else {
    us_internal_ssl_socket_context_free((us_internal_ssl_socket_context_t *)0x104e57);
  }
  return;
}

Assistant:

void us_socket_context_free(int ssl, struct us_socket_context_t *context) {
    /* We also simply free every copied string here */
    free((void *) context->options.ca_file_name);
    free((void *) context->options.cert_file_name);
    free((void *) context->options.dh_params_file_name);
    free((void *) context->options.key_file_name);
    free((void *) context->options.passphrase);

#ifndef LIBUS_NO_SSL
    if (ssl) {
        us_internal_ssl_socket_context_free((struct us_internal_ssl_socket_context_t *) context);
        return;
    }
#endif

    us_internal_loop_unlink(context->loop, context);
    free(context);
}